

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

SliceRange __thiscall soul::AST::ArrayElementRef::getResolvedSliceRange(ArrayElementRef *this)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  int64_t value;
  ArraySize AVar4;
  SliceRange SVar5;
  pool_ptr<soul::AST::Constant> c_1;
  Type type;
  pool_ptr<soul::AST::Constant> local_30;
  Type local_28;
  
  bVar1 = isSliceRangeValid(this);
  if (bVar1) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->startIndex);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_28,pEVar2);
    if (local_28._0_8_ == 0) {
      value = 0;
    }
    else {
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->((pool_ptr<soul::AST::Constant> *)&local_28)
      ;
      value = soul::Value::getAsInt64(&pCVar3->value);
    }
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_28,pEVar2);
    if ((this->endIndex).object == (Expression *)0x0) {
      AVar4 = Type::getArrayOrVectorSize(&local_28);
    }
    else {
      pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->endIndex);
      (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_30,pEVar2);
      if (local_30.object == (Constant *)0x0) {
        AVar4 = 0;
      }
      else {
        pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_30);
        AVar4 = soul::Value::getAsInt64(&pCVar3->value);
      }
    }
    SVar5.start = Type::convertArrayOrVectorIndexToValidRange<long>(&local_28,value);
    AVar4 = Type::convertArrayOrVectorIndexToValidRange<long>(&local_28,AVar4);
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
    SVar5.end = AVar4;
    return SVar5;
  }
  throwInternalCompilerError("isSliceRangeValid()","getResolvedSliceRange",0x9a4);
}

Assistant:

SliceRange getResolvedSliceRange() const
        {
            SOUL_ASSERT (isSliceRangeValid());
            int64_t start = 0, end = 0;

            if (auto c = startIndex->getAsConstant())
                start = c->value.getAsInt64();

            auto type = object->getResultType();

            if (endIndex == nullptr)
                end = (int64_t) type.getArrayOrVectorSize();
            else if (auto c = endIndex->getAsConstant())
                end = c->value.getAsInt64();

            return { type.convertArrayOrVectorIndexToValidRange (start),
                     type.convertArrayOrVectorIndexToValidRange (end) };
        }